

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  uint uVar1;
  char *pcVar3;
  uint *__s;
  ostringstream oss;
  string sStack_1a8;
  allocator local_188 [376];
  size_t sVar2;
  
  switch((char)*(ushort *)&this->field_0x8) {
  case '\x01':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x1151bc);
    break;
  case '\x02':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x1151bc);
    break;
  case '\x03':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    break;
  case '\x04':
    __s = (uint *)(this->value_).string_;
    if (__s != (uint *)0x0) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
        sVar2 = strlen((char *)__s);
        uVar1 = (uint)sVar2;
      }
      else {
        uVar1 = *__s;
        __s = __s + 1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s,(char *)((ulong)uVar1 + (long)__s));
      return __return_storage_ptr__;
    }
  case '\0':
    pcVar3 = "";
    goto LAB_00107492;
  case '\x05':
    pcVar3 = "false";
    if ((this->value_).bool_ != false) {
      pcVar3 = "true";
    }
LAB_00107492:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,local_188);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::operator<<((ostream *)local_188,"Type is not convertible to string");
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return JSONCPP_STRING(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}